

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O3

int __thiscall zmq::socket_base_t::term_endpoint(socket_base_t *this,char *endpoint_uri_)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  const_iterator __first;
  const_iterator cVar4;
  int *piVar5;
  const_iterator __last;
  mutex_t *mutex_;
  iterator it;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
  pVar6;
  string endpoint_uri_str;
  scoped_optional_lock_t sync_lock;
  string uri_protocol;
  string resolved_endpoint_uri;
  string uri_path;
  string local_d8;
  scoped_optional_lock_t local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  mutex_ = (mutex_t *)0x0;
  if (this->_thread_safe != false) {
    mutex_ = &this->_sync;
  }
  scoped_optional_lock_t::scoped_optional_lock_t(&local_b8,mutex_);
  if (this->_ctx_terminated == true) {
    piVar5 = __errno_location();
    *piVar5 = 0x9523dfd;
  }
  else if (endpoint_uri_ == (char *)0x0) {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
  }
  else {
    iVar1 = process_commands(this,0,false);
    if (iVar1 == 0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      iVar1 = parse_uri(endpoint_uri_,&local_b0,&local_50);
      iVar2 = -1;
      if ((iVar1 == 0) && (iVar1 = check_protocol(this,&local_b0), iVar1 == 0)) {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        sVar3 = strlen(endpoint_uri_);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,endpoint_uri_,endpoint_uri_ + sVar3);
        iVar1 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar1 == 0) {
          iVar1 = object_t::unregister_endpoint((object_t *)this,&local_d8,this);
          if (iVar1 == 0) {
            iVar2 = 0;
          }
          else {
            iVar2 = inprocs_t::erase_pipes(&this->_inprocs,&local_d8);
          }
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_b0);
          if (iVar1 == 0) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_d8._M_dataplus._M_p,
                       local_d8._M_dataplus._M_p + local_d8._M_string_length);
            resolve_tcp_addr(&local_90,this,&local_70,local_50._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,local_d8._M_dataplus._M_p,
                       local_d8._M_dataplus._M_p + local_d8._M_string_length);
          }
          pVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
                  ::equal_range(&(this->_endpoints)._M_t,&local_90);
          __last._M_node = (_Base_ptr)pVar6.second._M_node;
          __first._M_node = (_Base_ptr)pVar6.first._M_node;
          cVar4._M_node = __first._M_node;
          if (__first._M_node == __last._M_node) {
            piVar5 = __errno_location();
            *piVar5 = 2;
            iVar2 = -1;
          }
          else {
            do {
              if ((pipe_t *)cVar4._M_node[2]._M_parent != (pipe_t *)0x0) {
                pipe_t::terminate((pipe_t *)cVar4._M_node[2]._M_parent,false);
              }
              own_t::term_child(&this->super_own_t,*(own_t **)(cVar4._M_node + 2));
              cVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar4._M_node);
            } while (cVar4._M_node != __last._M_node);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
            ::_M_erase_aux(&(this->_endpoints)._M_t,__first,__last);
            iVar2 = 0;
            if (((this->super_own_t).options.reconnect_stop & 3) != 0) {
              this->_disconnected = true;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_001dd5d9;
    }
  }
  iVar2 = -1;
LAB_001dd5d9:
  scoped_optional_lock_t::~scoped_optional_lock_t(&local_b8);
  return iVar2;
}

Assistant:

int zmq::socket_base_t::term_endpoint (const char *endpoint_uri_)
{
    scoped_optional_lock_t sync_lock (_thread_safe ? &_sync : NULL);

    //  Check whether the context hasn't been shut down yet.
    if (unlikely (_ctx_terminated)) {
        errno = ETERM;
        return -1;
    }

    //  Check whether endpoint address passed to the function is valid.
    if (unlikely (!endpoint_uri_)) {
        errno = EINVAL;
        return -1;
    }

    //  Process pending commands, if any, since there could be pending unprocessed process_own()'s
    //  (from launch_child() for example) we're asked to terminate now.
    const int rc = process_commands (0, false);
    if (unlikely (rc != 0)) {
        return -1;
    }

    //  Parse endpoint_uri_ string.
    std::string uri_protocol;
    std::string uri_path;
    if (parse_uri (endpoint_uri_, uri_protocol, uri_path)
        || check_protocol (uri_protocol)) {
        return -1;
    }

    const std::string endpoint_uri_str = std::string (endpoint_uri_);

    // Disconnect an inproc socket
    if (uri_protocol == protocol_name::inproc) {
        return unregister_endpoint (endpoint_uri_str, this) == 0
                 ? 0
                 : _inprocs.erase_pipes (endpoint_uri_str);
    }

    const std::string resolved_endpoint_uri =
      uri_protocol == protocol_name::tcp
        ? resolve_tcp_addr (endpoint_uri_str, uri_path.c_str ())
        : endpoint_uri_str;

    //  Find the endpoints range (if any) corresponding to the endpoint_uri_pair_ string.
    const std::pair<endpoints_t::iterator, endpoints_t::iterator> range =
      _endpoints.equal_range (resolved_endpoint_uri);
    if (range.first == range.second) {
        errno = ENOENT;
        return -1;
    }

    for (endpoints_t::iterator it = range.first; it != range.second; ++it) {
        //  If we have an associated pipe, terminate it.
        if (it->second.second != NULL)
            it->second.second->terminate (false);
        term_child (it->second.first);
    }
    _endpoints.erase (range.first, range.second);

    if (options.reconnect_stop & ZMQ_RECONNECT_STOP_AFTER_DISCONNECT) {
        _disconnected = true;
    }

    return 0;
}